

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cc
# Opt level: O0

string * __thiscall
google::protobuf::util::status_internal::Status::ToString_abi_cxx11_
          (string *__return_storage_ptr__,Status *this)

{
  undefined1 auVar1 [12];
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  allocator local_19;
  Status *local_18;
  Status *this_local;
  
  local_18 = this;
  this_local = (Status *)__return_storage_ptr__;
  if (this->error_code_ == kOk) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"OK",&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  else {
    auVar1 = std::__cxx11::string::empty();
    if ((auVar1 & (undefined1  [12])0x1) == (undefined1  [12])0x0) {
      (anonymous_namespace)::StatusCodeToString_abi_cxx11_
                (&local_70,(_anonymous_namespace_ *)(ulong)this->error_code_,auVar1._8_4_);
      std::operator+(&local_50,&local_70,":");
      std::operator+(__return_storage_ptr__,&local_50,&this->error_message_);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
    }
    else {
      (anonymous_namespace)::StatusCodeToString_abi_cxx11_
                (__return_storage_ptr__,(_anonymous_namespace_ *)(ulong)this->error_code_,
                 auVar1._8_4_);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Status::ToString() const {
  if (error_code_ == StatusCode::kOk) {
    return "OK";
  } else {
    if (error_message_.empty()) {
      return StatusCodeToString(error_code_);
    } else {
      return StatusCodeToString(error_code_) + ":" + error_message_;
    }
  }
}